

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_copy_key_material(psa_key_slot_t *source,psa_key_slot_t *target)

{
  size_t sVar1;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  size_t local_40;
  size_t length;
  size_t buffer_size;
  uint8_t *buffer;
  psa_key_slot_t *ppStack_20;
  psa_status_t status;
  psa_key_slot_t *target_local;
  psa_key_slot_t *source_local;
  
  buffer_size = 0;
  length = 0;
  ppStack_20 = target;
  target_local = source;
  if ((((source->attr).type & 0x7000) == 0x1000) || (((source->attr).type & 0x7000) == 0x2000)) {
    sVar1 = psa_get_key_slot_bits(source);
    local_48 = sVar1 + 7 >> 3;
  }
  else {
    if ((source->attr).type == 0x7001) {
      sVar1 = psa_get_key_slot_bits(source);
      local_50 = (((sVar1 >> 1) + 1 >> 3) + 5) * 9 + 0xe;
    }
    else {
      if ((source->attr).type == 0x4001) {
        sVar1 = psa_get_key_slot_bits(source);
        local_58 = (sVar1 >> 3) + 0x10;
      }
      else {
        if ((source->attr).type == 0x7002) {
          sVar1 = psa_get_key_slot_bits(source);
          local_60 = ((sVar1 >> 3) + 5) * 3 + 0x4b;
        }
        else {
          if ((source->attr).type == 0x4002) {
            sVar1 = psa_get_key_slot_bits(source);
            local_68 = ((sVar1 >> 3) + 5) * 3 + 0x3b;
          }
          else {
            if (((source->attr).type & 0xff00) == 0x7100) {
              sVar1 = psa_get_key_slot_bits(source);
              local_70 = sVar1 + 7 >> 3;
            }
            else {
              if (((source->attr).type & 0xff00) == 0x4100) {
                sVar1 = psa_get_key_slot_bits(source);
                local_78 = (sVar1 + 7 >> 3) * 2 + 1;
              }
              else {
                local_78 = 0;
              }
              local_70 = local_78;
            }
            local_68 = local_70;
          }
          local_60 = local_68;
        }
        local_58 = local_60;
      }
      local_50 = local_58;
    }
    local_48 = local_50;
  }
  length = local_48;
  buffer_size = (size_t)calloc(1,local_48);
  if ((uint8_t *)buffer_size == (uint8_t *)0x0) {
    source_local._4_4_ = -0x8d;
  }
  else {
    buffer._4_4_ = psa_internal_export_key(target_local,(uint8_t *)buffer_size,length,&local_40,0);
    if (buffer._4_4_ == 0) {
      (ppStack_20->attr).type = (target_local->attr).type;
      buffer._4_4_ = psa_import_key_into_slot(ppStack_20,(uint8_t *)buffer_size,local_40);
    }
    mbedtls_platform_zeroize((void *)buffer_size,length);
    free((void *)buffer_size);
    source_local._4_4_ = buffer._4_4_;
  }
  return source_local._4_4_;
}

Assistant:

static psa_status_t psa_copy_key_material( const psa_key_slot_t *source,
                                           psa_key_slot_t *target )
{
    psa_status_t status;
    uint8_t *buffer = NULL;
    size_t buffer_size = 0;
    size_t length;

    buffer_size = PSA_KEY_EXPORT_MAX_SIZE( source->attr.type,
                                           psa_get_key_slot_bits( source ) );
    buffer = mbedtls_calloc( 1, buffer_size );
    if( buffer == NULL )
        return( PSA_ERROR_INSUFFICIENT_MEMORY );
    status = psa_internal_export_key( source, buffer, buffer_size, &length, 0 );
    if( status != PSA_SUCCESS )
        goto exit;
    target->attr.type = source->attr.type;
    status = psa_import_key_into_slot( target, buffer, length );

exit:
    mbedtls_platform_zeroize( buffer, buffer_size );
    mbedtls_free( buffer );
    return( status );
}